

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeNaN.cpp
# Opt level: O1

bool __thiscall wasm::DeNaN::hasNaNLane(DeNaN *this,Const *c)

{
  int64_t iVar1;
  undefined1 local_58 [8];
  Literal value;
  undefined1 local_28 [8];
  Literal test32;
  
  if ((c->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id == 6) {
    Literal::Literal((Literal *)local_58,&c->value);
    Literal::eqF32x4((Literal *)local_28,(Literal *)local_58,(Literal *)local_58);
    Literal::allTrueI32x4((Literal *)&value.type,(Literal *)local_28);
    Literal::operator=((Literal *)local_28,(Literal *)&value.type);
    Literal::~Literal((Literal *)&value.type);
    iVar1 = Literal::getInteger((Literal *)local_28);
    Literal::~Literal((Literal *)local_28);
    Literal::~Literal((Literal *)local_58);
    return iVar1 == 0;
  }
  __assert_fail("c->type == Type::v128",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DeNaN.cpp"
                ,0xce,"bool wasm::DeNaN::hasNaNLane(Const *)");
}

Assistant:

bool hasNaNLane(Const* c) {
    assert(c->type == Type::v128);
    auto value = c->value;

    // Compute if all f32s are equal to themselves.
    auto test32 = value.eqF32x4(value);
    test32 = test32.allTrueI32x4();

    return !test32.getInteger();
  }